

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

void InitDefaultsscc_info_Option_google_2fprotobuf_2ftype_2eproto(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2df5a4,0x2df5a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/type.pb.cc"
            );
  google::protobuf::Option::Option((Option *)google::protobuf::_Option_default_instance_);
  google::protobuf::internal::OnShutdownDestroyMessage(google::protobuf::_Option_default_instance_);
  google::protobuf::_Option_default_instance_._24_8_ = google::protobuf::_Any_default_instance_;
  return;
}

Assistant:

static void InitDefaultsscc_info_Option_google_2fprotobuf_2ftype_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_Option_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::Option();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::Option::InitAsDefaultInstance();
}